

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

ostream * operator<<(ostream *o,span<const_double> *d)

{
  ulong uVar1;
  double *pdVar2;
  long lVar3;
  
  uVar1 = d->_len;
  if (7 < uVar1) {
    pdVar2 = d->_base;
    lVar3 = 0;
    while( true ) {
      std::ostream::_M_insert<double>(*(double *)((long)pdVar2 + lVar3));
      if ((uVar1 & 0xfffffffffffffff8) - 8 == lVar3) break;
      std::operator<<(o,' ');
      lVar3 = lVar3 + 8;
    }
  }
  return o;
}

Assistant:

std::ostream &operator<<(std::ostream &o, const mpt::span<T> &d)
{
	typename mpt::span<T>::iterator begin = d.begin(), end = d.end();
	if (begin == end) {
		return o;
	}
	o << *begin;
	while (++begin != end) {
		o << ' ' << *begin;
	}
	return o;
}